

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

void __thiscall
FBlockThingsIterator::FBlockThingsIterator
          (FBlockThingsIterator *this,int _minx,int _miny,int _maxx,int _maxy)

{
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::TArray(&this->DynHash,0)
  ;
  this->minx = _minx;
  this->maxx = _maxx;
  this->miny = _miny;
  this->maxy = _maxy;
  ClearHash(this);
  Reset(this);
  return;
}

Assistant:

FBlockThingsIterator::FBlockThingsIterator(int _minx, int _miny, int _maxx, int _maxy)
: DynHash(0)
{
	minx = _minx;
	maxx = _maxx;
	miny = _miny;
	maxy = _maxy;
	ClearHash();
	Reset();
}